

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarking.cpp
# Opt level: O0

void bench_get_msurf_descriptor
               (vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
                *functions,integral_image *iimage,
               vector<interest_point,_std::allocator<interest_point>_> *interest_points,
               vector<benchmark_data,_std::allocator<benchmark_data>_> *data)

{
  size_type sVar1;
  reference pvVar2;
  reference __src;
  vector<benchmark_data,_std::allocator<benchmark_data>_> *in_RCX;
  vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
  *in_RDI;
  interest_point ipoint;
  int i;
  int _b;
  int _a;
  int counter;
  int j;
  ulong in_stack_fffffffffffffe58;
  reference in_stack_fffffffffffffe60;
  int local_15c;
  undefined1 local_14c [52];
  benchmark_data *in_stack_fffffffffffffee8;
  interest_point *in_stack_fffffffffffffef0;
  integral_image *in_stack_fffffffffffffef8;
  _func_void_integral_image_ptr_interest_point_ptr *in_stack_ffffffffffffff00;
  int local_38;
  int local_24;
  
  for (local_24 = 0;
      sVar1 = std::
              vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
              ::size(in_RDI), (ulong)(long)local_24 < sVar1; local_24 = local_24 + 1) {
    pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                       (in_RCX,(long)local_24);
    local_15c = *(int *)(pvVar2 + 0x208);
    if (5 < local_15c) {
      local_15c = 5;
    }
    for (local_38 = 0; local_38 < local_15c; local_38 = local_38 + 1) {
      __src = std::vector<interest_point,_std::allocator<interest_point>_>::at
                        ((vector<interest_point,_std::allocator<interest_point>_> *)
                         in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      memcpy(local_14c,__src,0x114);
      std::
      vector<void_(*)(integral_image_*,_interest_point_*),_std::allocator<void_(*)(integral_image_*,_interest_point_*)>_>
      ::operator[](in_RDI,(long)local_24);
      std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                (in_RCX,(long)local_24);
      perf_get_msurf_descriptor
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8);
    }
    if (local_15c != 0) {
      in_stack_fffffffffffffe58 = (ulong)local_15c;
      in_stack_fffffffffffffe60 =
           std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                     (in_RCX,(long)local_24);
      *(ulong *)(in_stack_fffffffffffffe60 + 0x218) =
           *(ulong *)(in_stack_fffffffffffffe60 + 0x218) / in_stack_fffffffffffffe58;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_RCX,(long)local_24);
      *(ulong *)(pvVar2 + 0x228) = *(ulong *)(pvVar2 + 0x228) / (ulong)(long)local_15c;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_RCX,(long)local_24);
      *(ulong *)(pvVar2 + 0x220) = *(ulong *)(pvVar2 + 0x220) / (ulong)(long)local_15c;
      pvVar2 = std::vector<benchmark_data,_std::allocator<benchmark_data>_>::operator[]
                         (in_RCX,(long)local_24);
      *(double *)(pvVar2 + 0x230) = *(double *)(pvVar2 + 0x230) / (double)local_15c;
    }
  }
  return;
}

Assistant:

void bench_get_msurf_descriptor(
    const std::vector<void (*)(struct integral_image *, struct interest_point *)> &functions,
    struct integral_image *iimage, std::vector<struct interest_point> *interest_points,
    std::vector<struct benchmark_data> &data) {
    assert(functions.size() == data.size());

    // Iterating through all functions that should be benchmarked
    for (int j = 0; j < functions.size(); ++j) {
        // Specifies how many times the timing for get_msurf_descriptor will be called. The average will be taken.
        int counter = MIN(5, data[j].num_interest_points);
        for (int i = 0; i < counter; ++i) {
            struct interest_point ipoint = interest_points->at(i);
            perf_get_msurf_descriptor(functions[j], iimage, &ipoint, data[j]);
        }

        // Take the average of the runs.
        if (counter != 0) {
            data[j].avg_cycles /= counter;
            data[j].max_cycles /= counter;
            data[j].min_cycles /= counter;
            data[j].flops_per_cycle /= counter;
        }
    }
}